

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

BZFILE * bzopen_or_bzdopen(char *path,int fd,char *mode,int open_mode)

{
  char cVar1;
  ushort **ppuVar2;
  size_t sVar3;
  FILE *__stream;
  undefined8 *puVar4;
  BZFILE *pBVar5;
  int iVar6;
  int iVar7;
  undefined1 *puVar8;
  int iVar9;
  char mode2 [10];
  int bzerr;
  char *local_13c0;
  char unused [5000];
  
  mode2[8] = '\0';
  mode2[9] = '\0';
  mode2[0] = '\0';
  mode2[1] = '\0';
  mode2[2] = '\0';
  mode2[3] = '\0';
  mode2[4] = '\0';
  mode2[5] = '\0';
  mode2[6] = '\0';
  mode2[7] = '\0';
  puVar8 = (undefined1 *)0x0;
  if (mode == (char *)0x0) {
    return (BZFILE *)0x0;
  }
  iVar6 = 9;
  iVar9 = 0;
  local_13c0 = path;
  do {
    cVar1 = *mode;
    if (cVar1 == 'r') {
      puVar8 = (undefined1 *)0x0;
    }
    else if (cVar1 == 's') {
      iVar9 = 1;
    }
    else if (cVar1 == 'w') {
      puVar8 = &DAT_00000001;
    }
    else {
      if (cVar1 == '\0') {
        sVar3 = strlen(mode2);
        iVar7 = (int)puVar8;
        *(ushort *)(mode2 + sVar3) = (ushort)(iVar7 != 0) * 5 + 0x72;
        sVar3 = strlen(mode2);
        (mode2 + sVar3)[0] = 'b';
        (mode2 + sVar3)[1] = '\0';
        if (open_mode == 0) {
          if ((local_13c0 == (char *)0x0) || (*local_13c0 == '\0')) {
            if (iVar7 == 0) {
              puVar4 = (undefined8 *)&stdin;
            }
            else {
              puVar4 = (undefined8 *)&stdout;
            }
            __stream = (FILE *)*puVar4;
          }
          else {
            __stream = fopen64(local_13c0,mode2);
          }
        }
        else {
          __stream = fdopen(fd,mode2);
        }
        if (__stream != (FILE *)0x0) {
          if (iVar7 == 0) {
            pBVar5 = BZ2_bzReadOpen(&bzerr,(FILE *)__stream,0,iVar9,unused,0);
          }
          else {
            iVar9 = 1;
            if (1 < iVar6) {
              iVar9 = iVar6;
            }
            iVar6 = 9;
            if (iVar9 < 9) {
              iVar6 = iVar9;
            }
            pBVar5 = BZ2_bzWriteOpen(&bzerr,(FILE *)__stream,iVar6,0,0x1e);
          }
          if (pBVar5 != (BZFILE *)0x0) {
            return pBVar5;
          }
          if (__stream == _stdin) {
            return (BZFILE *)0x0;
          }
          if (__stream == _stdout) {
            return (BZFILE *)0x0;
          }
          fclose(__stream);
        }
        return (BZFILE *)0x0;
      }
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)(int)cVar1 * 2 + 1) & 8) != 0) {
        iVar6 = cVar1 + -0x30;
      }
    }
    mode = mode + 1;
  } while( true );
}

Assistant:

static
BZFILE * bzopen_or_bzdopen
               ( const char *path,   /* no use when bzdopen */
                 int fd,             /* no use when bzdopen */
                 const char *mode,
                 int open_mode)      /* bzopen: 0, bzdopen:1 */
{
   int    bzerr;
   char   unused[BZ_MAX_UNUSED];
   int    blockSize100k = 9;
   int    writing       = 0;
   char   mode2[10]     = "";
   FILE   *fp           = NULL;
   BZFILE *bzfp         = NULL;
   int    verbosity     = 0;
   int    workFactor    = 30;
   int    smallMode     = 0;
   int    nUnused       = 0; 

   if (mode == NULL) return NULL;
   while (*mode) {
      switch (*mode) {
      case 'r':
         writing = 0; break;
      case 'w':
         writing = 1; break;
      case 's':
         smallMode = 1; break;
      default:
         if (isdigit((int)(*mode))) {
            blockSize100k = *mode-BZ_HDR_0;
         }
      }
      mode++;
   }
   strcat(mode2, writing ? "w" : "r" );
   strcat(mode2,"b");   /* binary mode */

   if (open_mode==0) {
      if (path==NULL || strcmp(path,"")==0) {
        fp = (writing ? stdout : stdin);
        SET_BINARY_MODE(fp);
      } else {
        fp = fopen(path,mode2);
      }
   } else {
#ifdef BZ_STRICT_ANSI
      fp = NULL;
#else
      fp = fdopen(fd,mode2);
#endif
   }
   if (fp == NULL) return NULL;

   if (writing) {
      /* Guard against total chaos and anarchy -- JRS */
      if (blockSize100k < 1) blockSize100k = 1;
      if (blockSize100k > 9) blockSize100k = 9; 
      bzfp = BZ2_bzWriteOpen(&bzerr,fp,blockSize100k,
                             verbosity,workFactor);
   } else {
      bzfp = BZ2_bzReadOpen(&bzerr,fp,verbosity,smallMode,
                            unused,nUnused);
   }
   if (bzfp == NULL) {
      if (fp != stdin && fp != stdout) fclose(fp);
      return NULL;
   }
   return bzfp;
}